

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_calculator.cpp
# Opt level: O0

bool __thiscall
ON_ArithmeticCalculatorImplementation::AppendUnaryOperation
          (ON_ArithmeticCalculatorImplementation *this,double sign)

{
  bool local_19;
  bool rc;
  double sign_local;
  ON_ArithmeticCalculatorImplementation *this_local;
  
  local_19 = false;
  if (this->m_error_condition == '\0') {
    if ((this->m_bPendingUnaryMinus == '\0') && (this->m_bPendingUnaryPlus == '\0')) {
      if ((sign != 1.0) || (NAN(sign))) {
        if ((sign != -1.0) || (NAN(sign))) {
          SetErrorCondition(this,invalid_expression_error);
        }
        else {
          this->m_bPendingUnaryMinus = '\x01';
          local_19 = true;
        }
      }
      else {
        this->m_bPendingUnaryPlus = '\x01';
        local_19 = true;
      }
    }
    else {
      SetErrorCondition(this,invalid_expression_error);
    }
  }
  return local_19;
}

Assistant:

bool ON_ArithmeticCalculatorImplementation::AppendUnaryOperation(
  double sign
  )
{
  bool rc = false;

  for(;;)
  {
    if ( m_error_condition)
      break;

    if ( m_bPendingUnaryMinus || m_bPendingUnaryPlus )
    {
      SetErrorCondition(ON_ArithmeticCalculator::invalid_expression_error);
      break;
    }

    if ( 1.0 == sign )
    {
      m_bPendingUnaryPlus = true;
      rc = true;
      break;
    }

    if ( -1.0 == sign )
    {
      m_bPendingUnaryMinus = true;
      rc = true;
      break;
    }

    SetErrorCondition(ON_ArithmeticCalculator::invalid_expression_error);

    break;
  }

  return rc;
}